

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness_sim.c
# Opt level: O1

Vec_Ptr_t * populateLivenessVector(Abc_Ntk_t *pNtk,Aig_Man_t *pAig)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  char *pcVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  pVVar6 = pNtk->vPos;
  if (pVVar6->nSize < 1) {
    uVar8 = 0;
  }
  else {
    lVar9 = 0;
    uVar8 = 0;
    do {
      pcVar7 = Abc_ObjName((Abc_Obj_t *)pVVar6->pArray[lVar9]);
      pcVar7 = strstr(pcVar7,"assert_fair");
      if (pcVar7 != (char *)0x0) {
        if (pAig->vCos->nSize <= lVar9) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar3 = pAig->vCos->pArray[lVar9];
        uVar1 = pVVar4->nSize;
        uVar2 = pVVar4->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
            }
            iVar10 = 0x10;
          }
          else {
            iVar10 = uVar2 * 2;
            if (iVar10 <= (int)uVar2) goto LAB_006280d8;
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
            }
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = iVar10;
        }
LAB_006280d8:
        pVVar4->nSize = uVar1 + 1;
        pVVar4->pArray[(int)uVar1] = pvVar3;
        uVar8 = uVar8 + 1;
      }
      lVar9 = lVar9 + 1;
      pVVar6 = pNtk->vPos;
    } while (lVar9 < pVVar6->nSize);
  }
  printf("\nNumber of liveness property found = %d\n",(ulong)uVar8);
  return pVVar4;
}

Assistant:

static Vec_Ptr_t * populateLivenessVector( Abc_Ntk_t *pNtk, Aig_Man_t *pAig )
{
    Abc_Obj_t * pNode;
    int i, liveCounter = 0;
    Vec_Ptr_t * vLive;

    vLive = Vec_PtrAlloc( 100 );
    Abc_NtkForEachPo( pNtk, pNode, i )
        if( strstr( Abc_ObjName( pNode ), "assert_fair") != NULL )
        {
            Vec_PtrPush( vLive, Aig_ManCo( pAig, i ) );
            liveCounter++;
        }
    printf("\nNumber of liveness property found = %d\n", liveCounter);
    return vLive;
}